

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

bool __thiscall
caffe::LossParameter::MergePartialFromCodedStream(LossParameter *this,CodedInputStream *input)

{
  uint tag_00;
  CodedInputStream *input_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  UnknownFieldSet *pUVar5;
  bool local_89;
  LossParameter_NormalizationMode local_78;
  uint local_74;
  int value;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  LossParameter *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  unique0x100002aa = input;
LAB_00780f4b:
  _first_byte_or_zero = stack0xffffffffffffff98;
  kMax1ByteVarint = 0x7f;
  tag_2 = 0;
  if ((stack0xffffffffffffff98->buffer_ < stack0xffffffffffffff98->buffer_end_) &&
     (tag_2 = (uint32)*stack0xffffffffffffff98->buffer_,
     '\0' < (char)*stack0xffffffffffffff98->buffer_)) {
    local_24 = 0x7f;
    kMax2ByteVarint = (uint32)*stack0xffffffffffffff98->buffer_;
    google::protobuf::io::CodedInputStream::Advance(stack0xffffffffffffff98,1);
    local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
    tag_3._3_1_ = local_89;
    pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
    local_10 = pVar4.first;
    uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
  }
  else {
    local_3c[0] = google::protobuf::io::CodedInputStream::ReadTagFallback
                            (stack0xffffffffffffff98,tag_2);
    local_3d = local_3c[0] - 1 < kMax1ByteVarint;
    pVar4 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
    local_10 = pVar4.first;
    uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
  }
  value._0_1_ = (undefined1)uStack_c;
  local_74 = local_10;
  p.first = local_74;
  if ((uStack_c & 1) != 0) {
    iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
    if (iVar2 == 1) {
      if ((p.first & 0xff) != 8) goto LAB_00781241;
      set_has_ignore_label(this);
      bVar1 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                        (stack0xffffffffffffff98,&this->ignore_label_);
      goto joined_r0x007811ce;
    }
    if (iVar2 == 2) {
      if ((p.first & 0xff) == 0x10) {
        set_has_normalize(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (stack0xffffffffffffff98,&this->normalize_);
        goto joined_r0x007811ce;
      }
      goto LAB_00781241;
    }
    if ((iVar2 == 3) && ((p.first & 0xff) == 0x18)) {
      bVar1 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                        (stack0xffffffffffffff98,(int *)&local_78);
      if (!bVar1) {
        return false;
      }
      bVar1 = LossParameter_NormalizationMode_IsValid(local_78);
      if (bVar1) {
        set_normalization(this,local_78);
      }
      else {
        pUVar5 = mutable_unknown_fields(this);
        google::protobuf::UnknownFieldSet::AddVarint(pUVar5,3,(long)(int)local_78);
      }
      goto LAB_00780f4b;
    }
  }
LAB_00781241:
  if ((p.first == 0) ||
     (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(p.first),
     input_00 = stack0xffffffffffffff98, tag_00 = p.first, WVar3 == WIRETYPE_END_GROUP)) {
    return true;
  }
  pUVar5 = mutable_unknown_fields(this);
  bVar1 = google::protobuf::internal::WireFormat::SkipField(input_00,tag_00,pUVar5);
joined_r0x007811ce:
  if (!bVar1) {
    return false;
  }
  goto LAB_00780f4b;
}

Assistant:

bool LossParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.LossParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional int32 ignore_label = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_ignore_label();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &ignore_label_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool normalize = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_normalize();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &normalize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.LossParameter.NormalizationMode normalization = 3 [default = VALID];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::LossParameter_NormalizationMode_IsValid(value)) {
            set_normalization(static_cast< ::caffe::LossParameter_NormalizationMode >(value));
          } else {
            mutable_unknown_fields()->AddVarint(3, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.LossParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.LossParameter)
  return false;
#undef DO_
}